

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int switch_case_2d(Color color,Directions direction)

{
  enum_fuse_t *peVar1;
  optional<enum_fuse_t> oVar2;
  _Storage<enum_fuse_t,_true> local_28;
  undefined1 local_20;
  Directions local_14;
  Color local_10;
  Directions direction_local;
  Color color_local;
  
  local_14 = direction;
  local_10 = color;
  oVar2 = magic_enum::enum_fuse<Color,Directions>(color,direction);
  local_28._M_value =
       oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
       super__Optional_payload_base<enum_fuse_t>._M_payload;
  local_20 = oVar2.super__Optional_base<enum_fuse_t,_true,_true>._M_payload.
             super__Optional_payload_base<enum_fuse_t>._M_engaged;
  peVar1 = Catch::clara::std::optional<enum_fuse_t>::value((optional<enum_fuse_t> *)&local_28);
  if (*peVar1 == 6) {
    direction_local = 2;
  }
  else if (*peVar1 == 8) {
    direction_local = 1;
  }
  else {
    direction_local = 0;
  }
  return direction_local;
}

Assistant:

static int switch_case_2d(Color color, Directions direction) {
  switch (enum_fuse(color, direction).value()) {
    case enum_fuse(Color::RED, Directions::Up).value():
      return 1;
    case enum_fuse(Color::BLUE, Directions::Down).value():
      return 2;
    default:
      return 0;
  }
}